

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated_filter.c
# Opt level: O0

void test_truncation(char *compression,_func_int_archive_ptr *set_compression,int can_prog)

{
  size_t sVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  archive *paVar5;
  la_ssize_t v2;
  char *pcVar6;
  size_t sVar7;
  bool local_7d;
  int use_prog;
  int r;
  int i;
  size_t used1;
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  char path [16];
  archive *a;
  archive_entry *ae;
  _func_int_archive_ptr *p_Stack_18;
  int can_prog_local;
  _func_int_archive_ptr *set_compression_local;
  char *compression_local;
  
  datasize = 2000000;
  ae._4_4_ = can_prog;
  p_Stack_18 = set_compression;
  set_compression_local = (_func_int_archive_ptr *)compression;
  data = (char *)malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                   ,L'.',(uint)(data != (char *)0x0),"NULL != (buff = malloc(buffsize))",(void *)0x0
                  );
  if (data != (char *)0x0) {
    used1 = 10000;
    buffsize = (size_t)malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'3',(uint)((void *)buffsize != (void *)0x0),
                     "NULL != (data = malloc(datasize))",(void *)0x0);
    if (buffsize == 0) {
      free(data);
    }
    else {
      memset((void *)buffsize,0,used1);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'=',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar2 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar2 = archive_write_add_filter_compress(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                          ,L'@',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_compress(a)",
                          paVar5);
      iVar2 = (*p_Stack_18)(paVar5);
      if ((iVar2 == 0) || (ae._4_4_ != 0)) {
        local_7d = iVar2 == -0x14 && ae._4_4_ != 0;
        iVar2 = archive_write_set_bytes_per_block(paVar5,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'L',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar5);
        iVar2 = archive_write_open_memory(paVar5,data,datasize,(size_t *)&r);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'N',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar5);
        a = (archive *)archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                         ,L'O',(uint)((archive_entry *)a != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype((archive_entry *)a,0x8000);
        archive_entry_set_size((archive_entry *)a,used1);
        for (use_prog = 0; use_prog < 100; use_prog = use_prog + 1) {
          snprintf((char *)&buff,0x10,"%s%d",set_compression_local,(ulong)(uint)use_prog);
          archive_entry_copy_pathname((archive_entry *)a,(char *)&buff);
          failure("%s",&buff);
          iVar2 = archive_write_header(paVar5,(archive_entry *)a);
          wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                      ,L'W',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)"
                                      ,paVar5);
          if (wVar3 == L'\0') {
            archive_write_free(paVar5);
            free((void *)buffsize);
            free(data);
            return;
          }
          fill_with_pseudorandom_data((void *)buffsize,used1);
          failure("%s",&buff);
          sVar1 = used1;
          v2 = archive_write_data(paVar5,(void *)buffsize,used1);
          wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                                      ,L'`',sVar1,"datasize",v2,
                                      "archive_write_data(a, data, datasize)",paVar5);
          if (wVar3 == L'\0') {
            archive_write_free(paVar5);
            free((void *)buffsize);
            free(data);
            return;
          }
        }
        archive_entry_free((archive_entry *)a);
        iVar2 = archive_write_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'h',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar5);
        iVar2 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'i',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar5 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                         ,L'k',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'l',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar5);
        iVar2 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'm',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar2 = archive_read_open_memory(paVar5,data,_r - (_r >> 6));
        if (iVar2 == 0) {
          for (use_prog = 0; use_prog < 100; use_prog = use_prog + 1) {
            iVar2 = archive_read_next_header(paVar5,(archive_entry **)&a);
            if (iVar2 != 0) {
              failure("Should have non-NULL error message for %s",set_compression_local);
              pcVar6 = archive_error_string(paVar5);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                               ,L'z',(uint)(pcVar6 != (char *)0x0),"NULL != archive_error_string(a)"
                               ,(void *)0x0);
              break;
            }
            snprintf((char *)&buff,0x10,"%s%d",set_compression_local,(ulong)(uint)use_prog);
            pcVar6 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'~',(char *)&buff,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            sVar1 = used1;
            sVar7 = archive_read_data(paVar5,(void *)buffsize,used1);
            if (sVar1 != sVar7) {
              failure("Should have non-NULL error message for %s",set_compression_local);
              pcVar6 = archive_error_string(paVar5);
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                               ,L'\x82',(uint)(pcVar6 != (char *)0x0),
                               "NULL != archive_error_string(a)",(void *)0x0);
              break;
            }
          }
          iVar2 = 0;
          if (local_7d) {
            iVar2 = -0x14;
          }
          iVar4 = archive_read_close(paVar5);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                              ,L'\x87',(long)iVar2,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                              "archive_read_close(a)",paVar5);
          iVar2 = archive_read_free(paVar5);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                              ,L'\x88',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0
                             );
        }
        else {
          pcVar6 = archive_error_string(paVar5);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                     ,L'r',"truncated bzip2 input","\"truncated bzip2 input\"",pcVar6,
                     "archive_error_string(a)",paVar5,L'\0');
        }
        free((void *)buffsize);
        free(data);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'C');
        test_skipping("%s writing not supported on this platform",set_compression_local);
        iVar2 = archive_write_free(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                            ,L'E',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        free(data);
        free((void *)buffsize);
      }
    }
  }
  return;
}

Assistant:

static void
test_truncation(const char *compression,
    int (*set_compression)(struct archive *), int can_prog)
{
	struct archive_entry *ae;
	struct archive* a;
	char path[16];
	char *buff, *data;
	size_t buffsize, datasize, used1;
	int i, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a bunch of files with semi-random data.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	r = (*set_compression)(a);
	if (r != ARCHIVE_OK && !can_prog) {
		skipping("%s writing not supported on this platform",
		    compression);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	use_prog = (r == ARCHIVE_WARN && can_prog);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "%s%d", compression, i);
		archive_entry_copy_pathname(ae, path);
		failure("%s", path);
		if (!assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
		fill_with_pseudorandom_data(data, datasize);
		failure("%s", path);
		if (!assertEqualIntA(a, datasize,
		    archive_write_data(a, data, datasize))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));

	r = archive_read_open_memory(a, buff, used1 - used1/64);
	if (r != ARCHIVE_OK) {
		assertEqualStringA(a, "truncated bzip2 input",
		    archive_error_string(a));
		    goto out;
	}

	for (i = 0; i < 100; i++) {
		if (ARCHIVE_OK != archive_read_next_header(a, &ae)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
		snprintf(path, sizeof(path), "%s%d", compression, i);
		assertEqualString(path, archive_entry_pathname(ae));
		if (datasize != (size_t)archive_read_data(a, data, datasize)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
	}
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

out:
	free(data);
	free(buff);
}